

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdpx.cpp
# Opt level: O0

ScenarioLowerBound * __thiscall
despot::POMDPX::CreateScenarioLowerBound(POMDPX *this,string *name,string *particle_bound_name)

{
  ACT_TYPE action_00;
  StateIndexer *pSVar1;
  StateIndexer *policy_00;
  bool bVar2;
  int iVar3;
  DSPOMDP *pDVar4;
  undefined4 extraout_var;
  POMCPPrior *prior;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  POMDPX *pPVar5;
  undefined4 extraout_var_03;
  ostream *poVar6;
  string local_1a0 [32];
  string local_180;
  ACT_TYPE local_15c;
  undefined1 local_158 [4];
  int action;
  undefined1 local_131;
  string local_130 [39];
  allocator<char> local_109;
  string local_108;
  undefined1 local_e1;
  string local_e0 [39];
  undefined1 local_b9;
  string local_b8 [39];
  allocator<char> local_91;
  string local_90;
  undefined1 local_69;
  string local_68 [32];
  StateIndexer *local_48;
  StateIndexer *indexer;
  StatePolicy *policy;
  string *local_28;
  string *particle_bound_name_local;
  string *name_local;
  POMDPX *this_local;
  
  local_28 = particle_bound_name;
  particle_bound_name_local = name;
  name_local = (string *)this;
  if (((this->is_small_ & 1U) == 0) &&
     ((bVar2 = std::operator==(name,"MAJORITY"), bVar2 ||
      (bVar2 = std::operator==(name,"MODE"), bVar2)))) {
    pPVar5 = (POMDPX *)operator_new(0x10);
    TrivialParticleLowerBound::TrivialParticleLowerBound
              ((TrivialParticleLowerBound *)pPVar5,&this->super_DSPOMDP);
    this_local = pPVar5;
  }
  else {
    indexer = (StateIndexer *)&this->super_StatePolicy;
    local_48 = &this->super_StateIndexer;
    bVar2 = std::operator==(name,"TRIVIAL");
    if ((bVar2) || (bVar2 = std::operator==(name,"DEFAULT"), bVar2)) {
      pPVar5 = (POMDPX *)operator_new(0x10);
      TrivialParticleLowerBound::TrivialParticleLowerBound
                ((TrivialParticleLowerBound *)pPVar5,&this->super_DSPOMDP);
      this_local = pPVar5;
    }
    else {
      bVar2 = std::operator==(name,"RANDOM");
      if (bVar2) {
        pPVar5 = (POMDPX *)operator_new(0x38);
        local_69 = 1;
        pDVar4 = &this->super_DSPOMDP;
        std::__cxx11::string::string(local_68,(string *)particle_bound_name);
        iVar3 = (*pDVar4->_vptr_DSPOMDP[0xe])(pDVar4,local_68);
        RandomPolicy::RandomPolicy
                  ((RandomPolicy *)pPVar5,pDVar4,(ParticleLowerBound *)CONCAT44(extraout_var,iVar3))
        ;
        local_69 = 0;
        this_local = pPVar5;
        std::__cxx11::string::~string(local_68);
      }
      else {
        bVar2 = std::operator==(name,"POMCP");
        if (bVar2) {
          pPVar5 = (POMDPX *)operator_new(0x20);
          prior = (POMCPPrior *)operator_new(0x78);
          UniformPOMCPPrior::UniformPOMCPPrior((UniformPOMCPPrior *)prior,&this->super_DSPOMDP);
          POMCPScenarioLowerBound::POMCPScenarioLowerBound
                    ((POMCPScenarioLowerBound *)pPVar5,&this->super_DSPOMDP,prior,(Belief *)0x0);
          this_local = pPVar5;
        }
        else {
          bVar2 = std::operator==(name,"MAJORITY");
          if (bVar2) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"MDP",&local_91);
            ComputeDefaultActions(this,&local_90);
            std::__cxx11::string::~string((string *)&local_90);
            std::allocator<char>::~allocator(&local_91);
            pPVar5 = (POMDPX *)operator_new(0x28);
            pSVar1 = indexer;
            local_b9 = 1;
            pDVar4 = &this->super_DSPOMDP;
            std::__cxx11::string::string(local_b8,(string *)particle_bound_name);
            iVar3 = (*pDVar4->_vptr_DSPOMDP[0xe])(pDVar4,local_b8);
            MajorityActionPolicy::MajorityActionPolicy
                      ((MajorityActionPolicy *)pPVar5,pDVar4,(StatePolicy *)pSVar1,
                       (ParticleLowerBound *)CONCAT44(extraout_var_00,iVar3));
            local_b9 = 0;
            this_local = pPVar5;
            std::__cxx11::string::~string(local_b8);
          }
          else {
            bVar2 = std::operator==(name,"GREEDY");
            if (bVar2) {
              pPVar5 = (POMDPX *)operator_new(0x28);
              local_e1 = 1;
              pDVar4 = &this->super_DSPOMDP;
              std::__cxx11::string::string(local_e0,(string *)particle_bound_name);
              iVar3 = (*pDVar4->_vptr_DSPOMDP[0xe])(pDVar4,local_e0);
              POMDPXGreedyActionPolicy::POMDPXGreedyActionPolicy
                        ((POMDPXGreedyActionPolicy *)pPVar5,pDVar4,
                         (ParticleLowerBound *)CONCAT44(extraout_var_01,iVar3));
              local_e1 = 0;
              this_local = pPVar5;
              std::__cxx11::string::~string(local_e0);
            }
            else {
              bVar2 = std::operator==(name,"MODE");
              if (bVar2) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_108,"MDP",&local_109);
                ComputeDefaultActions(this,&local_108);
                std::__cxx11::string::~string((string *)&local_108);
                std::allocator<char>::~allocator(&local_109);
                pPVar5 = (POMDPX *)operator_new(0x48);
                policy_00 = indexer;
                pSVar1 = local_48;
                local_131 = 1;
                pDVar4 = &this->super_DSPOMDP;
                std::__cxx11::string::string(local_130,(string *)particle_bound_name);
                iVar3 = (*pDVar4->_vptr_DSPOMDP[0xe])(pDVar4,local_130);
                ModeStatePolicy::ModeStatePolicy
                          ((ModeStatePolicy *)pPVar5,pDVar4,pSVar1,(StatePolicy *)policy_00,
                           (ParticleLowerBound *)CONCAT44(extraout_var_02,iVar3));
                local_131 = 0;
                this_local = pPVar5;
                std::__cxx11::string::~string(local_130);
              }
              else {
                std::__cxx11::string::substr((ulong)local_158,(ulong)name);
                bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_158,"BLIND");
                std::__cxx11::string::~string((string *)local_158);
                if (!bVar2) {
                  poVar6 = std::operator<<((ostream *)&std::cerr,
                                           "Unsupported scenario lower bound: ");
                  poVar6 = std::operator<<(poVar6,(string *)name);
                  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                  exit(1);
                }
                std::__cxx11::string::substr((ulong)&local_180,(ulong)name);
                iVar3 = std::__cxx11::stoi(&local_180,(size_t *)0x0,10);
                std::__cxx11::string::~string((string *)&local_180);
                local_15c = iVar3;
                pPVar5 = (POMDPX *)operator_new(0x28);
                action_00 = local_15c;
                pDVar4 = &this->super_DSPOMDP;
                std::__cxx11::string::string(local_1a0,(string *)particle_bound_name);
                iVar3 = (*pDVar4->_vptr_DSPOMDP[0xe])(pDVar4,local_1a0);
                BlindPolicy::BlindPolicy
                          ((BlindPolicy *)pPVar5,pDVar4,action_00,
                           (ParticleLowerBound *)CONCAT44(extraout_var_03,iVar3));
                this_local = pPVar5;
                std::__cxx11::string::~string(local_1a0);
              }
            }
          }
        }
      }
    }
  }
  return (ScenarioLowerBound *)this_local;
}

Assistant:

ScenarioLowerBound* POMDPX::CreateScenarioLowerBound(string name,
	string particle_bound_name) const {
	if (!is_small_ && (name == "MAJORITY" || name == "MODE")) {
		return new TrivialParticleLowerBound(this);
	}

	const StatePolicy* policy = this;
	const StateIndexer* indexer = this;

	if (name == "TRIVIAL" || name == "DEFAULT") {
		return new TrivialParticleLowerBound(this);
	} else if (name == "RANDOM") {
		return new RandomPolicy(this,
			CreateParticleLowerBound(particle_bound_name));
	} else if (name == "POMCP") {
		return new POMCPScenarioLowerBound(this, new UniformPOMCPPrior(this));
	} else if (name == "MAJORITY") {
		ComputeDefaultActions("MDP");
		return new MajorityActionPolicy(this, *policy,
			CreateParticleLowerBound(particle_bound_name));
	} else if (name == "GREEDY") {
		return new POMDPXGreedyActionPolicy(this,
			CreateParticleLowerBound(particle_bound_name));
	} else if (name == "MODE") {
		ComputeDefaultActions("MDP");
		return new ModeStatePolicy(this, *indexer, *policy,
			CreateParticleLowerBound(particle_bound_name));
	} else if (name.substr(0, 5) == "BLIND") { 
		int action = stoi(name.substr(5)); 
		return new BlindPolicy(this, action, 
				CreateParticleLowerBound(particle_bound_name)); 
	} else {
		cerr << "Unsupported scenario lower bound: " << name << endl;
		exit(1);
		return NULL;
	}
}